

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_gl.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  byte local_21;
  EGLContext local_20;
  EGLContext egl_ctx;
  EGLDisplay egl_dpy;
  _Bool pass;
  
  egl_dpy._4_4_ = 0;
  egl_dpy._3_1_ = 1;
  (*_epoxy_glXGetCurrentContext)();
  (*_epoxy_eglGetCurrentContext)();
  init_egl(&egl_ctx,&local_20);
  _Var1 = make_egl_current_and_test(egl_ctx,local_20);
  local_21 = 0;
  if (_Var1) {
    local_21 = egl_dpy._3_1_;
  }
  return (int)((local_21 & 1) != 1);
}

Assistant:

int main(void)
{
    bool pass = true;
    EGLDisplay egl_dpy;
    EGLContext egl_ctx;

    /* Force epoxy to have loaded both EGL and GLX libs already -- we
     * can't assume anything about symbol resolution based on having
     * EGL or GLX loaded.
     */
    (void)glXGetCurrentContext();
    (void)eglGetCurrentContext();

    init_egl(&egl_dpy, &egl_ctx);
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;

    return pass != true;
}